

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O3

void __thiscall AVavoomLightColor::BeginPlay(AVavoomLightColor *this)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  ADynamicLight *pAVar4;
  
  iVar2 = (this->super_AVavoomLight).super_ADynamicLight.super_AActor.args[0];
  iVar3 = (this->super_AVavoomLight).super_ADynamicLight.super_AActor.args[3];
  uVar1 = *(undefined8 *)((this->super_AVavoomLight).super_ADynamicLight.super_AActor.args + 1);
  pAVar4 = &(this->super_AVavoomLight).super_ADynamicLight;
  (pAVar4->super_AActor).args[2] = 0;
  (pAVar4->super_AActor).args[3] = 0;
  (this->super_AVavoomLight).super_ADynamicLight.super_AActor.args[4] = 0;
  (this->super_AVavoomLight).super_ADynamicLight.m_Radius[0] = iVar2 << 2;
  *(ulong *)(this->super_AVavoomLight).super_ADynamicLight.super_AActor.args =
       CONCAT44((int)((long)uVar1 >> 0x21),(int)uVar1 >> 1);
  (this->super_AVavoomLight).super_ADynamicLight.super_AActor.args[2] = iVar3 >> 1;
  AVavoomLight::BeginPlay(&this->super_AVavoomLight);
  return;
}

Assistant:

void AVavoomLightColor::BeginPlay ()
{
	int l_args[5];
	memcpy(l_args, args, sizeof(l_args));
	memset(args, 0, sizeof(args));
	m_Radius[0] = l_args[0] * 4;
	args[LIGHT_RED] = l_args[1] >> 1;
	args[LIGHT_GREEN] = l_args[2] >> 1;
	args[LIGHT_BLUE] = l_args[3] >> 1;

	Super::BeginPlay();
}